

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

bool __thiscall spvtools::opt::IfConversion::CheckType(IfConversion *this,uint32_t id)

{
  Op opcode;
  int32_t iVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar2 = analysis::DefUseManager::GetDef(this_00,id);
  opcode = pIVar2->opcode_;
  iVar1 = spvOpcodeIsScalarType(opcode);
  return (opcode == OpTypeVector || opcode == OpTypePointer) || iVar1 != 0;
}

Assistant:

bool IfConversion::CheckType(uint32_t id) {
  Instruction* type = get_def_use_mgr()->GetDef(id);
  spv::Op op = type->opcode();
  if (spvOpcodeIsScalarType(op) || op == spv::Op::OpTypePointer ||
      op == spv::Op::OpTypeVector)
    return true;
  return false;
}